

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void getBundlePart(char *fullpath,uint length,uint *newLength)

{
  int iVar1;
  uint uVar2;
  
  if (newLength != (uint *)0x0) {
    uVar2 = 0;
    if (length != 0 && fullpath != (char *)0x0) {
      iVar1 = strncmp(fullpath + ((ulong)length - 0xf),"/Contents/MacOS",0xf);
      uVar2 = 0;
      if (iVar1 == 0) {
        uVar2 = length - 0xf;
      }
    }
    *newLength = uVar2;
  }
  return;
}

Assistant:

void getBundlePart(const char * fullpath, unsigned int length, unsigned int * newLength)
{
    if (newLength == 0x0)
    {
        return;
    }

    if (fullpath == 0x0 || length == 0)
    {
        *newLength = 0;

        return;
    }

    // check for /Contents/MacOS
    const char * potentialBundleStart = fullpath + length - macOSBundlePathLength;

    if (strncmp(potentialBundleStart, macOSBundlePath, macOSBundlePathLength) != 0)
    {
        // No bundle
        *newLength = 0;

        return;
    }

    *newLength = length - macOSBundlePathLength;
}